

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * __thiscall
TypeInfo::compose(string *__return_storage_ptr__,TypeInfo *this,string *nameSpace,string *prefix_)

{
  size_type sVar1;
  string *psVar2;
  bool bVar3;
  char *__rhs;
  char *__rhs_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  allocator<char> local_f9;
  string *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __rhs_00 = " ";
  __rhs = " ";
  if ((this->prefix)._M_string_length == 0) {
    __rhs = "";
  }
  local_f8 = __return_storage_ptr__;
  std::operator+(&local_90,&this->prefix,__rhs);
  sVar1 = nameSpace->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&local_d0,&this->type);
  }
  else {
    __x._M_str = (prefix_->_M_dataplus)._M_p;
    __x._M_len = prefix_->_M_string_length;
    bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(&this->type,__x);
    if (bVar3) {
      std::operator+(&local_f0,nameSpace,"::");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f9);
    }
    stripPrefix(&local_b0,&this->type,prefix_);
    std::operator+(&local_d0,&local_f0,&local_b0);
  }
  std::operator+(&local_70,&local_90,&local_d0);
  if ((this->postfix)._M_string_length == 0) {
    __rhs_00 = "";
  }
  std::operator+(&local_50,&local_70,__rhs_00);
  psVar2 = local_f8;
  std::operator+(local_f8,&local_50,&this->postfix);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return psVar2;
}

Assistant:

std::string compose( std::string const & nameSpace, std::string const & prefix_ = "Vk" ) const
  {
    return prefix + ( prefix.empty() ? "" : " " ) +
           ( nameSpace.empty() ? type : ( ( ( type.starts_with( prefix_ ) ) ? ( nameSpace + "::" ) : "" ) + stripPrefix( type, prefix_ ) ) ) +
           ( postfix.empty() ? "" : " " ) + postfix;
  }